

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O3

void __thiscall Assimp::ASEImporter::AddMeshes(ASEImporter *this,BaseNode *snode,aiNode *node)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  aiColor4D *paVar13;
  aiMesh *paVar14;
  uint *puVar15;
  aiVector3D *paVar16;
  aiVector3D *paVar17;
  aiScene *paVar18;
  ulong uVar19;
  BaseNode *pBVar20;
  ulong uVar21;
  aiMatrix4x4 m;
  aiMatrix4x4t<float> local_78;
  
  paVar18 = this->pcScene;
  if (paVar18->mNumMeshes != 0) {
    uVar19 = 0;
    do {
      paVar13 = paVar18->mMeshes[uVar19]->mColors[2];
      pBVar20 = (BaseNode *)&paVar13[4].b;
      if (paVar13 == (aiColor4D *)0x0) {
        pBVar20 = (BaseNode *)0x0;
      }
      if (pBVar20 == snode) {
        node->mNumMeshes = node->mNumMeshes + 1;
        paVar18 = this->pcScene;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < paVar18->mNumMeshes);
  }
  if ((ulong)node->mNumMeshes != 0) {
    puVar15 = (uint *)operator_new__((ulong)node->mNumMeshes << 2);
    node->mMeshes = puVar15;
    paVar18 = this->pcScene;
    if (paVar18->mNumMeshes != 0) {
      uVar21 = 0;
      uVar19 = 0;
      do {
        paVar14 = paVar18->mMeshes[uVar21];
        paVar13 = paVar14->mColors[2];
        pBVar20 = (BaseNode *)&paVar13[4].b;
        if (paVar13 == (aiColor4D *)0x0) {
          pBVar20 = (BaseNode *)0x0;
        }
        if (pBVar20 == snode) {
          node->mMeshes[uVar19] = (uint)uVar21;
          local_78.a1 = paVar13[9].r;
          local_78.a2 = paVar13[9].g;
          local_78.a3 = paVar13[9].b;
          local_78.a4 = paVar13[9].a;
          local_78.b1 = paVar13[10].r;
          local_78.b2 = paVar13[10].g;
          local_78.b3 = paVar13[10].b;
          local_78.b4 = paVar13[10].a;
          local_78.c1 = paVar13[0xb].r;
          local_78.c2 = paVar13[0xb].g;
          local_78.c3 = paVar13[0xb].b;
          local_78.c4 = paVar13[0xb].a;
          local_78.d1 = paVar13[0xc].r;
          local_78.d2 = paVar13[0xc].g;
          local_78.d3 = paVar13[0xc].b;
          local_78.d4 = paVar13[0xc].a;
          aiMatrix4x4t<float>::Inverse(&local_78);
          if ((ulong)paVar14->mNumVertices != 0) {
            paVar16 = paVar14->mVertices;
            paVar17 = paVar16 + paVar14->mNumVertices;
            do {
              fVar1 = paVar16->x;
              fVar2 = paVar16->y;
              fVar3 = paVar16->z;
              paVar16->x = local_78.a4 +
                           fVar3 * local_78.a3 + fVar1 * local_78.a1 + local_78.a2 * fVar2;
              paVar16->y = local_78.b4 +
                           fVar3 * local_78.b3 + fVar1 * local_78.b1 + local_78.b2 * fVar2;
              paVar16->z = fVar3 * local_78.c3 + fVar1 * local_78.c1 + fVar2 * local_78.c2 +
                           local_78.c4;
              paVar16 = paVar16 + 1;
            } while (paVar16 != paVar17);
          }
          paVar17 = paVar14->mNormals;
          if ((paVar17 != (aiVector3D *)0x0) && ((ulong)paVar14->mNumVertices != 0)) {
            fVar1 = paVar13[9].b;
            fVar2 = paVar13[10].b;
            uVar7 = paVar13[9].r;
            uVar10 = paVar13[9].g;
            uVar8 = paVar13[10].r;
            uVar11 = paVar13[10].g;
            uVar9 = paVar13[0xb].r;
            uVar12 = paVar13[0xb].g;
            fVar3 = paVar13[0xb].b;
            paVar16 = paVar17 + paVar14->mNumVertices;
            do {
              fVar4 = paVar17->x;
              fVar5 = paVar17->y;
              fVar6 = paVar17->z;
              paVar17->x = fVar6 * (float)uVar9 + fVar4 * (float)uVar7 + fVar5 * (float)uVar8;
              paVar17->y = fVar6 * (float)uVar12 + fVar4 * (float)uVar10 + fVar5 * (float)uVar11;
              paVar17->z = fVar1 * fVar4 + fVar2 * fVar5 + fVar3 * fVar6;
              paVar17 = paVar17 + 1;
            } while (paVar17 != paVar16);
          }
          uVar19 = (ulong)((int)uVar19 + 1);
          paVar18 = this->pcScene;
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 < paVar18->mNumMeshes);
    }
  }
  return;
}

Assistant:

void ASEImporter::AddMeshes(const ASE::BaseNode* snode,aiNode* node)
{
    for (unsigned int i = 0; i < pcScene->mNumMeshes;++i)   {
        // Get the name of the mesh (the mesh instance has been temporarily stored in the third vertex color)
        const aiMesh* pcMesh  = pcScene->mMeshes[i];
        const ASE::Mesh* mesh = (const ASE::Mesh*)pcMesh->mColors[2];

        if (mesh == snode) {
            ++node->mNumMeshes;
        }
    }

    if(node->mNumMeshes)    {
        node->mMeshes = new unsigned int[node->mNumMeshes];
        for (unsigned int i = 0, p = 0; i < pcScene->mNumMeshes;++i)    {

            const aiMesh* pcMesh  = pcScene->mMeshes[i];
            const ASE::Mesh* mesh = (const ASE::Mesh*)pcMesh->mColors[2];
            if (mesh == snode)  {
                node->mMeshes[p++] = i;

                // Transform all vertices of the mesh back into their local space ->
                // at the moment they are pretransformed
                aiMatrix4x4 m  = mesh->mTransform;
                m.Inverse();

                aiVector3D* pvCurPtr = pcMesh->mVertices;
                const aiVector3D* pvEndPtr = pvCurPtr + pcMesh->mNumVertices;
                while (pvCurPtr != pvEndPtr)    {
                    *pvCurPtr = m * (*pvCurPtr);
                    pvCurPtr++;
                }

                // Do the same for the normal vectors, if we have them.
                // As always, inverse transpose.
                if (pcMesh->mNormals)   {
                    aiMatrix3x3 m3 = aiMatrix3x3( mesh->mTransform );
                    m3.Transpose();

                    pvCurPtr = pcMesh->mNormals;
                    pvEndPtr = pvCurPtr + pcMesh->mNumVertices;
                    while (pvCurPtr != pvEndPtr)    {
                        *pvCurPtr = m3 * (*pvCurPtr);
                        pvCurPtr++;
                    }
                }
            }
        }
    }
}